

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventBroadcaster.h
# Opt level: O2

bool __thiscall
TgBot::EventBroadcaster::broadcastCommand(EventBroadcaster *this,string *command,Ptr *message)

{
  const_iterator cVar1;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_onCommandListeners)._M_h,command);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>);
    std::function<void_(std::shared_ptr<TgBot::Message>)>::operator()
              ((function<void_(std::shared_ptr<TgBot::Message>)> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
                      ._M_cur + 0x28),(shared_ptr<TgBot::Message> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return cVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

inline bool broadcastCommand(const std::string command, const Message::Ptr message) const {
        std::unordered_map<std::string, MessageListener>::const_iterator iter = _onCommandListeners.find(command);
        if (iter == _onCommandListeners.end()) {
            return false;
        }
        iter->second(message);
        return true;
    }